

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O0

TPZSavable * __thiscall
TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>_>::Restore
          (TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>_> *this)

{
  long *plVar1;
  TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism> *ptr;
  undefined8 local_30;
  TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism> *in_stack_fffffffffffffff0;
  
  plVar1 = (long *)operator_new(0x2b0);
  TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>::TPZGeoElement
            (in_stack_fffffffffffffff0);
  local_30 = (TPZSavable *)0x0;
  if (plVar1 != (long *)0x0) {
    local_30 = (TPZSavable *)((long)plVar1 + *(long *)(*plVar1 + -0x60));
  }
  return local_30;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }